

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_3x3_winograd.h
# Opt level: O2

void ncnn::get_optimal_tile_mnk(int M,int N,int K,int *TILE_M,int *TILE_N,int *TILE_K,int nT)

{
  float fVar1;
  undefined1 auVar2 [16];
  uint uVar3;
  int iVar4;
  int iVar5;
  ulong uVar6;
  uint uVar7;
  float fVar8;
  
  uVar3 = get_cpu_level2_cache_size();
  if (nT == 0) {
    nT = get_physical_big_cpu_count();
  }
  if ((long)(int)uVar3 < 0) {
    fVar8 = (float)((ulong)(uVar3 & 1) | (ulong)(long)(int)uVar3 >> 1);
    fVar8 = fVar8 + fVar8;
  }
  else {
    fVar8 = (float)(int)uVar3;
  }
  fVar1 = fVar8 * 0.25;
  auVar2 = vsqrtss_avx(ZEXT416((uint)(fVar8 * 0.083333336)),ZEXT416((uint)(fVar8 * 0.083333336)));
  iVar4 = ((int)auVar2._0_4_ / 8) * 8;
  if (iVar4 < 9) {
    iVar4 = 8;
  }
  *TILE_M = iVar4;
  iVar4 = get_physical_cpu_count();
  if (nT <= iVar4) {
    iVar4 = nT;
  }
  uVar7 = iVar4 * *TILE_M;
  iVar4 = (int)(M + uVar7 + -1) / (int)uVar7;
  uVar3 = (((M + iVar4 + -1) / iVar4 + 7) / 8) * 8;
  if ((int)uVar7 <= (int)uVar3) {
    uVar3 = uVar7;
  }
  if (1 < nT) {
    iVar4 = 1;
    if (1 < (int)uVar3 / nT) {
      iVar4 = (int)uVar3 / nT;
    }
    uVar7 = iVar4 + 7U & 0x7ffffff8;
    if ((int)uVar7 < (int)uVar3) {
      uVar3 = uVar7;
    }
  }
  *TILE_M = uVar3;
  auVar2 = vsqrtss_avx(ZEXT416((uint)fVar1),ZEXT416((uint)fVar1));
  iVar4 = ((int)(auVar2._0_4_ - (float)(int)uVar3) / 8) * 8;
  if (iVar4 < 9) {
    iVar4 = 8;
  }
  iVar5 = (iVar4 + K + -1) / iVar4;
  iVar5 = (((iVar5 + K + -1) / iVar5 + 7) / 8) * 8;
  if (iVar4 <= iVar5) {
    iVar5 = iVar4;
  }
  *TILE_K = iVar5;
  if (0 < N) {
    uVar3 = ((int)((fVar1 - (float)(*TILE_M * iVar5)) / (float)(*TILE_M + iVar5)) / 4) * 4;
    uVar6 = (ulong)uVar3;
    if ((int)uVar3 < 5) {
      uVar6 = 4;
    }
    uVar3 = (uint)uVar6;
    uVar6 = ((N + uVar3) - 1) / uVar6;
    uVar7 = (int)(((N + (int)uVar6) - 1) / uVar6) + 3U & 0xfffffffc;
    if (uVar3 <= uVar7) {
      uVar7 = uVar3;
    }
    *TILE_N = uVar7;
  }
  return;
}

Assistant:

static void get_optimal_tile_mnk(int M, int N, int K, int& TILE_M, int& TILE_N, int& TILE_K, int nT)
{
    // resolve optimal tile size from cache size
    const size_t l2_cache_size = get_cpu_level2_cache_size();

    if (nT == 0)
        nT = get_physical_big_cpu_count();

    // solve M
    {
        int tile_size = (int)sqrt((float)l2_cache_size / sizeof(float) / 3);

#if __AVX512F__
        TILE_M = std::max(16, tile_size / 16 * 16);
#elif __AVX__
        TILE_M = std::max(8, tile_size / 8 * 8);
#elif __SSE2__
        TILE_M = std::max(4, tile_size / 4 * 4);
#else
        TILE_M = std::max(2, tile_size / 2 * 2);
#endif

        TILE_M *= std::min(nT, get_physical_cpu_count());

        int nn_M = (M + TILE_M - 1) / TILE_M;
#if __AVX512F__
        TILE_M = std::min(TILE_M, ((M + nn_M - 1) / nn_M + 15) / 16 * 16);
#elif __AVX__
        TILE_M = std::min(TILE_M, ((M + nn_M - 1) / nn_M + 7) / 8 * 8);
#elif __SSE2__
        TILE_M = std::min(TILE_M, ((M + nn_M - 1) / nn_M + 3) / 4 * 4);
#else
        TILE_M = std::min(TILE_M, ((M + nn_M - 1) / nn_M + 1) / 2 * 2);
#endif

        if (nT > 1)
        {
#if __AVX512F__
            TILE_M = std::min(TILE_M, (std::max(1, TILE_M / nT) + 15) / 16 * 16);
#elif __AVX__
            TILE_M = std::min(TILE_M, (std::max(1, TILE_M / nT) + 7) / 8 * 8);
#elif __SSE2__
            TILE_M = std::min(TILE_M, (std::max(1, TILE_M / nT) + 3) / 4 * 4);
#else
            TILE_M = std::min(TILE_M, (std::max(1, TILE_M / nT) + 1) / 2 * 2);
#endif
        }
    }

    // solve K
    {
        int tile_size = (int)(sqrt((float)l2_cache_size / sizeof(float)) - TILE_M);

#if __AVX512F__
        TILE_K = std::max(16, tile_size / 16 * 16);
#elif __AVX__
        TILE_K = std::max(8, tile_size / 8 * 8);
#elif __SSE2__
        TILE_K = std::max(4, tile_size / 4 * 4);
#else
        TILE_K = std::max(2, tile_size / 2 * 2);
#endif

        int nn_K = (K + TILE_K - 1) / TILE_K;
#if __AVX512F__
        TILE_K = std::min(TILE_K, ((K + nn_K - 1) / nn_K + 15) / 16 * 16);
#elif __AVX__
        TILE_K = std::min(TILE_K, ((K + nn_K - 1) / nn_K + 7) / 8 * 8);
#elif __SSE2__
        TILE_K = std::min(TILE_K, ((K + nn_K - 1) / nn_K + 3) / 4 * 4);
#else
        TILE_K = std::min(TILE_K, ((K + nn_K - 1) / nn_K + 1) / 2 * 2);
#endif
    }

    if (N > 0)
    {
        int tile_size = (int)(((float)l2_cache_size / sizeof(float) - TILE_M * TILE_K) / (TILE_M + TILE_K));

#if __AVX512F__
        TILE_N = std::max(4, tile_size / 4 * 4);
#elif __AVX__
        TILE_N = std::max(4, tile_size / 4 * 4);
#elif __SSE2__
        TILE_N = std::max(4, tile_size / 4 * 4);
#else
        TILE_N = std::max(1, tile_size);
#endif

        int nn_N = (N + TILE_N - 1) / TILE_N;
#if __AVX512F__
        TILE_N = std::min(TILE_N, ((N + nn_N - 1) / nn_N + 3) / 4 * 4);
#elif __AVX__
        TILE_N = std::min(TILE_N, ((N + nn_N - 1) / nn_N + 3) / 4 * 4);
#elif __SSE2__
        TILE_N = std::min(TILE_N, ((N + nn_N - 1) / nn_N + 3) / 4 * 4);
#else
        TILE_N = std::min(TILE_N, (N + nn_N - 1) / nn_N);
#endif
    }
}